

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::DBTest::Reopen(DBTest *this,Options *options)

{
  AssertHelper *this_00;
  char *message;
  AssertionResult gtest_ar;
  undefined1 local_30 [16];
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> local_20 [8];
  undefined8 *local_18;
  
  TryReopen((DBTest *)local_30,(Options *)this);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            (local_20,local_30 + 8,(Status *)"TryReopen(options)");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__((void *)local_30._0_8_);
  }
  if (local_20[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_18 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_18;
    }
    this_00 = (AssertHelper *)(local_30 + 8);
    testing::internal::AssertHelper::AssertHelper
              (this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x11f,message);
    testing::internal::AssertHelper::operator=(this_00,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_30._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_30._0_8_ + 8))();
    }
  }
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

void Reopen(Options* options = nullptr) {
    ASSERT_LEVELDB_OK(TryReopen(options));
  }